

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

bool __thiscall PDA::Transducer::StoreFst::rollback(StoreFst *this)

{
  int iVar1;
  long *plVar2;
  pointer pRVar3;
  bool bVar4;
  int iVar5;
  Settings *this_00;
  _Elt_pointer pSVar6;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = Utils::Settings::Instance();
  bVar4 = Utils::Settings::isSyntaxTraceEnabled(this_00);
  if (bVar4) {
    *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,L"Rollback",8);
    plVar2 = *(long **)(std::__cxx11::wstring::operator= + *(long *)(std::wcout + -0x18));
    if (plVar2 == (long *)0x0) {
      std::__throw_bad_cast();
    }
    (**(code **)(*plVar2 + 0x50))(plVar2,10);
    std::wostream::put(L'\x00150238');
    std::wostream::flush();
  }
  if ((this->m_mostState).m_sourcePosition <= (this->m_currentState).m_sourcePosition) {
    iVar1 = (this->m_currentState).m_chainIndex;
    (this->m_mostState).m_ruleIndex = (this->m_currentState).m_ruleIndex;
    (this->m_mostState).m_chainIndex = iVar1;
    std::vector<wchar_t,_std::allocator<wchar_t>_>::operator=
              (&(this->m_mostState).m_stack,&(this->m_currentState).m_stack);
    (this->m_mostState).m_sourcePosition = (this->m_currentState).m_sourcePosition;
  }
  do {
    pSVar6 = (this->m_states).c.
             super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar6 == (this->m_states).c.
                  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_48[0] = local_38;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_48,L"Stack empty",L"");
      raise(this,(int)local_48);
    }
    if (pSVar6 == (this->m_states).c.
                  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar6 = (this->m_states).c.
               super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    iVar1 = pSVar6[-1].m_chainIndex;
    (this->m_currentState).m_ruleIndex = pSVar6[-1].m_ruleIndex;
    (this->m_currentState).m_chainIndex = iVar1;
    std::vector<wchar_t,_std::allocator<wchar_t>_>::operator=
              (&(this->m_currentState).m_stack,&pSVar6[-1].m_stack);
    (this->m_currentState).m_sourcePosition = pSVar6[-1].m_sourcePosition;
    std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
    ::pop_back(&(this->m_states).c);
    iVar5 = (this->m_currentState).m_chainIndex + 1;
    (this->m_currentState).m_chainIndex = iVar5;
    iVar1 = (this->m_currentState).m_ruleIndex;
    pRVar3 = (this->m_grammar).m_rules.
             super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while ((int)((ulong)((long)*(pointer *)
                                ((long)&pRVar3[iVar1].m_chains.
                                        super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                + 8) -
                        *(long *)&pRVar3[iVar1].m_chains.
                                  super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                        ) >> 5) <= iVar5);
  return true;
}

Assistant:

bool rollback()
    {
        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
            std::wcout << std::setw(10) << L"Rollback" << std::endl;
        if (m_currentState.m_sourcePosition >= m_mostState.m_sourcePosition)
            m_mostState = m_currentState;
        do
        {
            if (m_states.empty())
                raise(L"Stack empty");
            m_currentState = m_states.top();
            m_states.pop();
            ++m_currentState.m_chainIndex;
        } while (m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()));
        return true;
    }